

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O3

void mouseButtonFun(GLFWwindow *window,int button,int action,int mods)

{
  int iVar1;
  
  if (action == 1 && button == 0) {
    active_view = 1;
    iVar1 = 3;
    if ((double)(width / 2) <= xpos) {
      active_view = 2;
      iVar1 = 4;
    }
    if (ypos < (double)(height / 2)) {
      iVar1 = active_view;
    }
  }
  else {
    iVar1 = active_view;
    if (button == 0) {
      iVar1 = 0;
    }
  }
  active_view = iVar1;
  do_redraw = 0;
  return;
}

Assistant:

static void mouseButtonFun(GLFWwindow* window, int button, int action, int mods)
{
    if ((button == GLFW_MOUSE_BUTTON_LEFT) && action == GLFW_PRESS)
    {
        // Detect which of the four views was clicked
        active_view = 1;
        if (xpos >= width / 2)
            active_view += 1;
        if (ypos >= height / 2)
            active_view += 2;
    }
    else if (button == GLFW_MOUSE_BUTTON_LEFT)
    {
        // Deselect any previously selected view
        active_view = 0;
    }

    do_redraw = 1;
}